

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O2

bool __thiscall QSslContext::cacheSession(QSslContext *this,SSL *ssl)

{
  char cVar1;
  int iVar2;
  SSL_SESSION *pSVar3;
  SSL_SESSION *pSVar4;
  QLoggingCategory *pQVar5;
  unsigned_long uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  char local_48 [24];
  char *local_30;
  uchar *data;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar4 = this->session;
  if (pSVar4 != (SSL_SESSION *)0x0) {
    pSVar3 = q_SSL_get_session(ssl);
    if (pSVar4 == pSVar3) {
      bVar7 = true;
      goto LAB_0012980d;
    }
    if (this->session != (SSL_SESSION *)0x0) {
      q_SSL_SESSION_free(this->session);
    }
  }
  pSVar4 = q_SSL_get1_session(ssl);
  this->session = pSVar4;
  if (pSVar4 != (SSL_SESSION *)0x0) {
    cVar1 = QSslConfiguration::testSslOption
                      ((int)this +
                       (SslOptionDisableSessionPersistence|SslOptionDisableLegacyRenegotiation));
    if (cVar1 == '\0') {
      iVar2 = q_i2d_SSL_SESSION(this->session,(uchar **)0x0);
      if (0 < iVar2) {
        QByteArray::resize((longlong)&this->m_sessionASN1);
        data = (uchar *)QByteArray::data(&this->m_sessionASN1);
        iVar2 = q_i2d_SSL_SESSION(this->session,&data);
        if (iVar2 == 0) {
          pQVar5 = lcTlsBackend();
          if (((pQVar5->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
            local_30 = pQVar5->name;
            local_48[0] = '\x02';
            local_48[1] = '\0';
            local_48[2] = '\0';
            local_48[3] = '\0';
            local_48[4] = '\0';
            local_48[5] = '\0';
            local_48[6] = '\0';
            local_48[7] = '\0';
            local_48[8] = '\0';
            local_48[9] = '\0';
            local_48[10] = '\0';
            local_48[0xb] = '\0';
            local_48[0xc] = '\0';
            local_48[0xd] = '\0';
            local_48[0xe] = '\0';
            local_48[0xf] = '\0';
            local_48[0x10] = '\0';
            local_48[0x11] = '\0';
            local_48[0x12] = '\0';
            local_48[0x13] = '\0';
            local_48[0x14] = '\0';
            local_48[0x15] = '\0';
            local_48[0x16] = '\0';
            local_48[0x17] = '\0';
            QMessageLogger::warning(local_48,"could not store persistent version of SSL session");
          }
        }
        uVar6 = q_SSL_SESSION_get_ticket_lifetime_hint(this->session);
        this->m_sessionTicketLifeTimeHint = (int)uVar6;
      }
    }
  }
  bVar7 = this->session != (SSL_SESSION *)0x0;
LAB_0012980d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslContext::cacheSession(SSL* ssl)
{
    // don't cache the same session again
    if (session && session == q_SSL_get_session(ssl))
        return true;

    // decrease refcount of currently stored session
    // (this might happen if there are several concurrent handshakes in flight)
    if (session)
        q_SSL_SESSION_free(session);

    // cache the session the caller gave us and increase reference count
    session = q_SSL_get1_session(ssl);

    if (session && !sslConfiguration.testSslOption(QSsl::SslOptionDisableSessionPersistence)) {
        int sessionSize = q_i2d_SSL_SESSION(session, nullptr);
        if (sessionSize > 0) {
            m_sessionASN1.resize(sessionSize);
            unsigned char *data = reinterpret_cast<unsigned char *>(m_sessionASN1.data());
            if (!q_i2d_SSL_SESSION(session, &data))
                qCWarning(lcTlsBackend, "could not store persistent version of SSL session");
            m_sessionTicketLifeTimeHint = q_SSL_SESSION_get_ticket_lifetime_hint(session);
        }
    }

    return (session != nullptr);
}